

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O2

bool __thiscall
RootIndexProxyModel::dropMimeData
          (RootIndexProxyModel *this,QMimeData *data,DropAction action,int row,int column,
          QModelIndex *parent)

{
  RootIndexProxyModelPrivate *pRVar1;
  bool bVar2;
  undefined1 uVar3;
  long lVar4;
  long *plVar5;
  QModelIndex local_48;
  
  lVar4 = QAbstractProxyModel::sourceModel();
  if (lVar4 == 0) {
    uVar3 = 0;
  }
  else {
    pRVar1 = this->m_dptr;
    local_48.r = -1;
    local_48.c = -1;
    local_48.i = 0;
    local_48.m = (QAbstractItemModel *)0x0;
    bVar2 = QModelIndex::isValid(parent);
    if (bVar2) {
      (**(code **)(*(long *)this + 400))(&local_48,this,parent);
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pRVar1->m_rootIndex);
    }
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    uVar3 = (**(code **)(*plVar5 + 0xe0))(plVar5,data,action,row,column,&local_48);
  }
  return (bool)uVar3;
}

Assistant:

bool RootIndexProxyModel::dropMimeData(const QMimeData *data, Qt::DropAction action, int row, int column, const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return 0;
    Q_D(const RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    return sourceModel()->dropMimeData(data, action, row, column, sourceParent);
}